

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void mjs::throw_runtime_error(wstring_view *s,char *file,int line)

{
  char *local_50;
  size_t local_48;
  char local_40 [16];
  string_view local_30;
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)&local_50,s->_M_str,s->_M_str + s->_M_len);
  local_30._M_len = local_48;
  local_30._M_str = local_50;
  throw_runtime_error(&local_30,file,line);
}

Assistant:

[[noreturn]] void throw_runtime_error(const std::wstring_view& s, const char* file, int line) {
    throw_runtime_error(std::string(s.begin(), s.end()), file, line);
}